

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_resume_deferred_stream_item
              (nghttp2_session *session,nghttp2_stream *stream,uint8_t flags)

{
  int rv;
  uint8_t flags_local;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  session_local._4_4_ = nghttp2_stream_resume_deferred_item(stream,flags);
  if (session_local._4_4_ == 0) {
    if (((stream->flags & 0x10) == 0) || ((stream->flags & 0xc) != 0)) {
      session_local._4_4_ = 0;
    }
    else {
      session_local._4_4_ = session_ob_data_push(session,stream);
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_resume_deferred_stream_item(nghttp2_session *session,
                                               nghttp2_stream *stream,
                                               uint8_t flags) {
  int rv;

  rv = nghttp2_stream_resume_deferred_item(stream, flags);
  if (rv != 0) {
    return rv;
  }

  if (!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) ||
      (stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL)) {
    return 0;
  }

  return session_ob_data_push(session, stream);
}